

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_float.h
# Opt level: O1

istream * spvtools::utils::operator>>
                    (istream *is,
                    HexFloat<spvtools::utils::FloatProxy<float>,_spvtools::utils::HexFloatTraits<spvtools::utils::FloatProxy<float>_>_>
                    *value)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  void *pvVar10;
  uint_type uVar11;
  bool bVar12;
  uint uVar13;
  char cVar14;
  byte bVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  bool bVar19;
  bool bVar20;
  float float_val;
  float float_val_1;
  float float_val_2;
  uint local_64;
  
  (value->value_).data_ = 0;
  if (((byte)is[*(long *)(*(long *)is + -0x18) + 0x19] & 0x10) != 0) {
    while( true ) {
      iVar18 = std::istream::peek();
      iVar18 = isspace(iVar18);
      if (iVar18 == 0) break;
      std::istream::get();
    }
  }
  iVar3 = std::istream::peek();
  iVar18 = (int)is;
  if ((iVar3 != 0x2d) && (iVar3 != 0x30)) {
    std::istream::_M_extract<float>((float *)is);
    (value->value_).data_ = 0;
    if (((byte)is[*(long *)(*(long *)is + -0x18) + 0x20] & 5) == 0) {
      return is;
    }
    (value->value_).data_ = 0;
    return is;
  }
  iVar4 = iVar3;
  if (iVar3 == 0x2d) {
    std::istream::get();
    iVar4 = std::istream::peek();
  }
  if (iVar4 != 0x30) {
    if ((iVar3 == 0x2d) && ((iVar4 = std::istream::peek(), iVar4 == 0x2d || (iVar4 == 0x2b)))) {
      (value->value_).data_ = 0;
      std::ios::clear((int)*(undefined8 *)(*(long *)is + -0x18) + iVar18);
      if ((iVar4 - 0x2bU & 0xfffffffd) == 0) {
        return is;
      }
    }
    std::istream::_M_extract<float>((float *)is);
    uVar11 = 0x80000000;
    if (iVar3 != 0x2d) {
      uVar11 = 0;
    }
    (value->value_).data_ = uVar11;
    if (((byte)is[*(long *)(*(long *)is + -0x18) + 0x20] & 5) == 0) {
      return is;
    }
    (value->value_).data_ = 0;
    return is;
  }
  std::istream::get();
  uVar5 = std::istream::peek();
  if ((uVar5 & 0xffffffdf) == 0x58) {
    std::istream::get();
  }
  else {
    std::istream::unget();
    if ((iVar3 == 0x2d) && ((iVar4 = std::istream::peek(), iVar4 == 0x2d || (iVar4 == 0x2b)))) {
      (value->value_).data_ = 0;
      std::ios::clear((int)*(undefined8 *)(*(long *)is + -0x18) + iVar18);
      if ((iVar4 - 0x2bU & 0xfffffffd) == 0) goto LAB_0028f272;
    }
    std::istream::_M_extract<float>((float *)is);
    uVar11 = 0x80000000;
    if (iVar3 != 0x2d) {
      uVar11 = 0;
    }
    (value->value_).data_ = uVar11;
    if (((byte)is[*(long *)(*(long *)is + -0x18) + 0x20] & 5) != 0) {
      (value->value_).data_ = 0;
    }
  }
LAB_0028f272:
  if ((uVar5 & 0xffffffdf) != 0x58) {
    return is;
  }
  iVar4 = std::istream::peek();
  while (iVar4 == 0x30) {
    std::istream::get();
    iVar4 = std::istream::peek();
  }
  iVar8 = 0x7f;
  bVar20 = false;
  bVar12 = false;
  local_64 = 0;
  bVar1 = 0;
  bVar15 = 0;
  uVar5 = 0;
  do {
    if (iVar4 == 0x2e) {
      bVar12 = true;
    }
    else if (iVar4 == 0x70) {
      bVar20 = true;
    }
    else {
      iVar17 = isxdigit(iVar4);
      if (iVar17 == 0) goto LAB_0028f6cb;
      pvVar10 = memchr("0123456789",iVar4,0xb);
      if (pvVar10 == (void *)0x0) {
        cVar14 = 'M';
        pvVar10 = memchr("abcdef",iVar4,7);
        if (pvVar10 == (void *)0x0) {
          cVar14 = 'T';
          pvVar10 = memchr("ABCDEF",iVar4,7);
          if (pvVar10 == (void *)0x0) goto LAB_0028f7df;
        }
        bVar1 = ((char)pvVar10 - cVar14) + 10;
      }
      else {
        bVar1 = (char)pvVar10 + 0x43;
      }
      uVar16 = (uint)bVar1;
      bVar19 = false;
      uVar9 = 0;
      do {
        uVar6 = uVar16 & 8;
        iVar4 = iVar8;
        if (bVar15 == 0) {
LAB_0028f3ec:
          bVar15 = bVar15 | (byte)(uVar6 >> 3);
          bVar2 = true;
          iVar8 = iVar4;
        }
        else {
          uVar7 = (uVar6 >> 3) << (~(byte)uVar5 & 0x1f);
          if (uVar6 == 0) {
            uVar7 = 0;
          }
          if (0x1f < uVar5) {
            uVar7 = 0;
          }
          local_64 = local_64 | uVar7;
          uVar5 = uVar5 + 1;
          if (uVar5 == 0) {
            uVar5 = 0xffffffff;
          }
          iVar4 = iVar8 + 1;
          if (iVar8 != 0x7fffffff) goto LAB_0028f3ec;
          std::ios::clear(iVar18 + (int)*(undefined8 *)(*(long *)is + -0x18));
          bVar2 = false;
        }
        if (!bVar2) break;
        uVar16 = uVar16 * 2;
        bVar19 = 2 < uVar9;
        uVar9 = uVar9 + 1;
      } while (uVar9 != 4);
      bVar1 = 1;
      if (!bVar19) {
        return is;
      }
    }
    std::istream::get();
    iVar4 = std::istream::peek();
  } while ((!bVar20) && (!bVar12));
  if (!(bool)(bVar12 ^ 1U) && !bVar20) {
    uVar9 = 0;
    do {
      if (iVar4 == 0x70) {
        bVar20 = true;
      }
      else {
        iVar17 = isxdigit(iVar4);
        if (iVar17 == 0) goto LAB_0028f6cb;
        pvVar10 = memchr("0123456789",iVar4,0xb);
        if (pvVar10 == (void *)0x0) {
          cVar14 = 'M';
          pvVar10 = memchr("abcdef",iVar4,7);
          if (pvVar10 == (void *)0x0) {
            cVar14 = 'T';
            pvVar10 = memchr("ABCDEF",iVar4,7);
            if (pvVar10 == (void *)0x0) {
LAB_0028f7df:
              __assert_fail("false && \"This was called with a non-hex character\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/util/hex_float.h"
                            ,0x2dd,"uint8_t spvtools::utils::get_nibble_from_character(int)");
            }
          }
          bVar15 = ((char)pvVar10 - cVar14) + 10;
        }
        else {
          bVar15 = (char)pvVar10 + 0x43;
        }
        uVar6 = (uint)bVar15;
        uVar16 = 0;
        do {
          uVar7 = uVar6 >> 3 & 1;
          uVar9 = uVar9 | uVar7;
          if ((bVar1 == 0) && (uVar9 == 0)) {
            iVar8 = iVar8 + -1;
          }
          else {
            uVar13 = uVar7 << (~(byte)uVar5 & 0x1f);
            if (uVar7 == 0) {
              uVar13 = 0;
            }
            if (0x1f < uVar5) {
              uVar13 = 0;
            }
            local_64 = local_64 | uVar13;
            uVar5 = uVar5 + 1;
            if (uVar5 == 0) {
              uVar5 = 0xffffffff;
            }
          }
          uVar6 = uVar6 * 2;
          bVar19 = uVar16 < 3;
          uVar16 = uVar16 + 1;
        } while (uVar16 != 4);
        if (bVar19) {
          return is;
        }
      }
      std::istream::get();
      iVar4 = std::istream::peek();
    } while (!(bool)(bVar12 ^ 1U) && !bVar20);
  }
  bVar20 = false;
  bVar15 = 1;
  bVar12 = false;
  iVar17 = 0;
LAB_0028f5fb:
  if ((bVar12) || ((iVar4 != 0x2d && (iVar4 != 0x2b)))) {
    if (9 < iVar4 - 0x30U) {
      if (bVar12) {
        iVar17 = iVar17 * (char)bVar15;
        if ((iVar17 < 0) || (iVar8 < 0)) {
          if ((iVar17 < 0) && (iVar8 < 0)) {
            iVar18 = iVar8 + 0x7ffffffe;
            uVar5 = 0x80000002;
            if (iVar18 != -iVar17 && SBORROW4(iVar18,-iVar17) == iVar18 + iVar17 < 0) {
              uVar5 = iVar17 + iVar8;
            }
          }
          else {
            uVar5 = iVar17 + iVar8;
          }
        }
        else {
          uVar5 = iVar8 + iVar17;
          if (0x7ffffffe - iVar8 <= iVar17) {
            uVar5 = 0x7ffffffe;
          }
        }
        bVar20 = local_64 == 0;
        bVar12 = (bool)(~bVar1 & bVar20);
        uVar16 = uVar5 - 1;
        local_64 = local_64 << ~(bVar1 | bVar20);
        uVar9 = local_64 >> 1 | 0x80000000;
        if (bVar12) {
          uVar5 = 0;
          uVar9 = local_64;
        }
        if (bVar1 == 0 && !bVar20) {
          uVar5 = uVar16;
        }
        if (0 < (int)uVar5) {
          uVar9 = local_64;
        }
        uVar9 = uVar9 >> 9;
        if (((int)uVar5 < 0) && (!bVar12)) {
          uVar16 = uVar9;
          do {
            uVar9 = uVar16 >> 1;
            uVar5 = uVar5 + 1;
            if (uVar16 < 2) {
              bVar12 = true;
              uVar5 = 0;
            }
          } while (((int)uVar5 < 0) && (uVar16 = uVar9, bVar12 == false));
        }
        uVar16 = 0xff;
        if ((int)uVar5 < 0xff) {
          uVar16 = uVar5;
        }
        if (0xff < (int)uVar5) {
          uVar9 = 0;
        }
        (value->value_).data_ = (uVar16 & 0xff) << 0x17 | (uint)(iVar3 == 0x2d) << 0x1f | uVar9;
        return is;
      }
LAB_0028f6bd:
      iVar3 = (int)*(undefined8 *)(*(long *)is + -0x18);
LAB_0028f18f:
      std::ios::clear(iVar3 + iVar18);
      return is;
    }
    bVar12 = (int)((0x8000002eU - iVar4) / 10) <= iVar17;
    iVar17 = (iVar4 - 0x30U) + iVar17 * 10;
    if (bVar12) {
      iVar17 = 0x7ffffffe;
    }
    bVar12 = true;
  }
  else {
    if (bVar20) goto LAB_0028f6bd;
    bVar15 = -(iVar4 == 0x2d) | 1;
    bVar20 = true;
  }
  std::istream::get();
  iVar4 = std::istream::peek();
  goto LAB_0028f5fb;
LAB_0028f6cb:
  iVar3 = (int)*(undefined8 *)(*(long *)is + -0x18);
  goto LAB_0028f18f;
}

Assistant:

std::istream& operator>>(std::istream& is, HexFloat<T, Traits>& value) {
  using HF = HexFloat<T, Traits>;
  using uint_type = typename HF::uint_type;
  using int_type = typename HF::int_type;

  value.set_value(static_cast<typename HF::native_type>(0.f));

  if (is.flags() & std::ios::skipws) {
    // If the user wants to skip whitespace , then we should obey that.
    while (std::isspace(is.peek())) {
      is.get();
    }
  }

  auto next_char = is.peek();
  bool negate_value = false;

  if (next_char != '-' && next_char != '0') {
    return ParseNormalFloat(is, negate_value, value);
  }

  if (next_char == '-') {
    negate_value = true;
    is.get();
    next_char = is.peek();
  }

  if (next_char == '0') {
    is.get();  // We may have to unget this.
    auto maybe_hex_start = is.peek();
    if (maybe_hex_start != 'x' && maybe_hex_start != 'X') {
      is.unget();
      return ParseNormalFloat(is, negate_value, value);
    } else {
      is.get();  // Throw away the 'x';
    }
  } else {
    return ParseNormalFloat(is, negate_value, value);
  }

  // This "looks" like a hex-float so treat it as one.
  bool seen_p = false;
  bool seen_dot = false;

  // The mantissa bits, without the most significant 1 bit, and with the
  // the most recently read bits in the least significant positions.
  uint_type fraction = 0;
  // The number of mantissa bits that have been read, including the leading 1
  // bit that is not written into 'fraction'.
  uint_type fraction_index = 0;

  // TODO(dneto): handle overflow and underflow
  int_type exponent = HF::exponent_bias;

  // Strip off leading zeros so we don't have to special-case them later.
  while ((next_char = is.peek()) == '0') {
    is.get();
  }

  // Does the mantissa, as written, have non-zero digits to the left of
  // the decimal point.  Assume no until proven otherwise.
  bool has_integer_part = false;
  bool bits_written = false;  // Stays false until we write a bit.

  // Scan the mantissa hex digits until we see a '.' or the 'p' that
  // starts the exponent.
  while (!seen_p && !seen_dot) {
    // Handle characters that are left of the fractional part.
    if (next_char == '.') {
      seen_dot = true;
    } else if (next_char == 'p') {
      seen_p = true;
    } else if (::isxdigit(next_char)) {
      // We have stripped all leading zeroes and we have not yet seen a ".".
      has_integer_part = true;
      int number = get_nibble_from_character(next_char);
      for (int i = 0; i < 4; ++i, number <<= 1) {
        uint_type write_bit = (number & 0x8) ? 0x1 : 0x0;
        if (bits_written) {
          // If we are here the bits represented belong in the fractional
          // part of the float, and we have to adjust the exponent accordingly.
          fraction = detail::set_nth_most_significant_bit(fraction, write_bit,
                                                          fraction_index);
          // Increment the fraction index. If the input has bizarrely many
          // significant digits, then silently drop them.
          detail::saturated_inc(fraction_index);
          if (!detail::saturated_inc(exponent)) {
            // Overflow failure
            is.setstate(std::ios::failbit);
            return is;
          }
        }
        // Since this updated after setting fraction bits, this effectively
        // drops the leading 1 bit.
        bits_written |= write_bit != 0;
      }
    } else {
      // We have not found our exponent yet, so we have to fail.
      is.setstate(std::ios::failbit);
      return is;
    }
    is.get();
    next_char = is.peek();
  }

  // Finished reading the part preceding any '.' or 'p'.

  bits_written = false;
  while (seen_dot && !seen_p) {
    // Handle only fractional parts now.
    if (next_char == 'p') {
      seen_p = true;
    } else if (::isxdigit(next_char)) {
      int number = get_nibble_from_character(next_char);
      for (int i = 0; i < 4; ++i, number <<= 1) {
        uint_type write_bit = (number & 0x8) ? 0x01 : 0x00;
        bits_written |= write_bit != 0;
        if ((!has_integer_part) && !bits_written) {
          // Handle modifying the exponent here this way we can handle
          // an arbitrary number of hex values without overflowing our
          // integer.
          if (!detail::saturated_dec(exponent)) {
            // Overflow failure
            is.setstate(std::ios::failbit);
            return is;
          }
        } else {
          fraction = detail::set_nth_most_significant_bit(fraction, write_bit,
                                                          fraction_index);
          // Increment the fraction index. If the input has bizarrely many
          // significant digits, then silently drop them.
          detail::saturated_inc(fraction_index);
        }
      }
    } else {
      // We still have not found our 'p' exponent yet, so this is not a valid
      // hex-float.
      is.setstate(std::ios::failbit);
      return is;
    }
    is.get();
    next_char = is.peek();
  }

  // Finished reading the part preceding 'p'.
  // In hex floats syntax, the binary exponent is required.

  bool seen_exponent_sign = false;
  int8_t exponent_sign = 1;
  bool seen_written_exponent_digits = false;
  // The magnitude of the exponent, as written, or the sentinel value to signal
  // overflow.
  int_type written_exponent = 0;
  // A sentinel value signalling overflow of the magnitude of the written
  // exponent.  We'll assume that -written_exponent_overflow is valid for the
  // type. Later we may add 1 or subtract 1 from the adjusted exponent, so leave
  // room for an extra 1.
  const int_type written_exponent_overflow =
      std::numeric_limits<int_type>::max() - 1;
  while (true) {
    if (!seen_written_exponent_digits &&
        (next_char == '-' || next_char == '+')) {
      if (seen_exponent_sign) {
        is.setstate(std::ios::failbit);
        return is;
      }
      seen_exponent_sign = true;
      exponent_sign = (next_char == '-') ? -1 : 1;
    } else if (::isdigit(next_char)) {
      seen_written_exponent_digits = true;
      // Hex-floats express their exponent as decimal.
      int_type digit =
          static_cast<int_type>(static_cast<int_type>(next_char) - '0');
      if (written_exponent >= (written_exponent_overflow - digit) / 10) {
        // The exponent is very big. Saturate rather than overflow the exponent.
        // signed integer, which would be undefined behaviour.
        written_exponent = written_exponent_overflow;
      } else {
        written_exponent = static_cast<int_type>(
            static_cast<int_type>(written_exponent * 10) + digit);
      }
    } else {
      break;
    }
    is.get();
    next_char = is.peek();
  }
  if (!seen_written_exponent_digits) {
    // Binary exponent had no digits.
    is.setstate(std::ios::failbit);
    return is;
  }

  written_exponent = static_cast<int_type>(written_exponent * exponent_sign);
  // Now fold in the exponent bias into the written exponent, updating exponent.
  // But avoid undefined behaviour that would result from overflowing int_type.
  if (written_exponent >= 0 && exponent >= 0) {
    // Saturate up to written_exponent_overflow.
    if (written_exponent_overflow - exponent > written_exponent) {
      exponent = static_cast<int_type>(written_exponent + exponent);
    } else {
      exponent = written_exponent_overflow;
    }
  } else if (written_exponent < 0 && exponent < 0) {
    // Saturate down to -written_exponent_overflow.
    if (written_exponent_overflow + exponent > -written_exponent) {
      exponent = static_cast<int_type>(written_exponent + exponent);
    } else {
      exponent = static_cast<int_type>(-written_exponent_overflow);
    }
  } else {
    // They're of opposing sign, so it's safe to add.
    exponent = static_cast<int_type>(written_exponent + exponent);
  }

  bool is_zero = (!has_integer_part) && (fraction == 0);
  if ((!has_integer_part) && !is_zero) {
    fraction = static_cast<uint_type>(fraction << 1);
    exponent = static_cast<int_type>(exponent - 1);
  } else if (is_zero) {
    exponent = 0;
  }

  if (exponent <= 0 && !is_zero) {
    fraction = static_cast<uint_type>(fraction >> 1);
    fraction |= static_cast<uint_type>(1) << HF::top_bit_left_shift;
  }

  fraction = (fraction >> HF::fraction_right_shift) & HF::fraction_encode_mask;

  const int_type max_exponent =
      SetBits<uint_type, 0, HF::num_exponent_bits>::get;

  // Handle denorm numbers
  while (exponent < 0 && !is_zero) {
    fraction = static_cast<uint_type>(fraction >> 1);
    exponent = static_cast<int_type>(exponent + 1);

    fraction &= HF::fraction_encode_mask;
    if (fraction == 0) {
      // We have underflowed our fraction. We should clamp to zero.
      is_zero = true;
      exponent = 0;
    }
  }

  // We have overflowed so we should be inf/-inf.
  if (exponent > max_exponent) {
    exponent = max_exponent;
    fraction = 0;
  }

  uint_type output_bits = static_cast<uint_type>(
      static_cast<uint_type>(negate_value ? 1 : 0) << HF::top_bit_left_shift);
  output_bits |= fraction;

  uint_type shifted_exponent = static_cast<uint_type>(
      static_cast<uint_type>(exponent << HF::exponent_left_shift) &
      HF::exponent_mask);
  output_bits |= shifted_exponent;

  T output_float(output_bits);
  value.set_value(output_float);

  return is;
}